

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end,int server_preference)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ptls_cipher_suite_t *ppVar5;
  
  iVar1 = 0x28;
  if (src != end) {
    uVar3 = 0xffffffffffffffff;
    while (1 < (long)end - (long)src) {
      ppVar5 = *candidates;
      uVar4 = uVar3;
      if (ppVar5 != (ptls_cipher_suite_t *)0x0) {
        uVar2 = 0;
        do {
          if (ppVar5->id == (uint16_t)(*(ushort *)src << 8 | *(ushort *)src >> 8)) {
            if (server_preference == 0) goto LAB_0011385c;
            uVar4 = uVar2;
            if (uVar2 < uVar3) break;
          }
          ppVar5 = candidates[uVar2 + 1];
          uVar2 = uVar2 + 1;
          uVar4 = uVar3;
        } while (ppVar5 != (ptls_cipher_suite_t *)0x0);
      }
      src = (uint8_t *)((long)src + 2);
      uVar3 = uVar4;
      if (src == end) {
        if (uVar4 == 0xffffffffffffffff) {
          return 0x28;
        }
        ppVar5 = candidates[uVar4];
LAB_0011385c:
        *selected = ppVar5;
        return 0;
      }
    }
    iVar1 = 0x32;
  }
  return iVar1;
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end, int server_preference)
{
    size_t found_index = SIZE_MAX;
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        for (size_t i = 0; candidates[i] != NULL; ++i) {
            if (candidates[i]->id == id) {
                if (server_preference) {
                    /* preserve smallest matching index, and proceed to the next input */
                    if (i < found_index) {
                        found_index = i;
                        break;
                    }
                } else {
                    /* return the pointer matching to the first input that can be used */
                    *selected = candidates[i];
                    goto Exit;
                }
            }
        }
    }
    if (found_index != SIZE_MAX) {
        *selected = candidates[found_index];
        ret = 0;
    } else {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
    }

Exit:
    return ret;
}